

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colAlloc.c
# Opt level: O1

void ClearCells(Page *page,size_t first,size_t number)

{
  byte bVar1;
  size_t i;
  
  if (first < number + first) {
    do {
      bVar1 = (byte)first & 7;
      (*page)[(first >> 3) + 0x10] =
           (*page)[(first >> 3) + 0x10] & (-2 << bVar1 | 0xfeU >> 8 - bVar1);
      first = first + 1;
      number = number - 1;
    } while (number != 0);
  }
  return;
}

Assistant:

void
ClearCells(
    Page *page,     /*!< The page. */
    size_t first,   /*!< Index of first cell. */
    size_t number)  /*!< Number of cells in sequence. */
{
#if CELLS_PER_PAGE == 64
#   ifdef COL_BIGENDIAN
        *(uint64_t*) PAGE_BITMASK(page) &= ~(((((uint64_t)1)<<number)-1)<<(64-number-first));
#   else
        *(uint64_t*) PAGE_BITMASK(page) &= ~(((((uint64_t)1)<<number)-1)<<first);
#   endif
#else
    unsigned char *mask = PAGE_BITMASK(page);
    size_t i;
    for (i=first; i < first+number; i++) {
        mask[i>>3] &= ~(1<<(i&7));
    }
#endif
}